

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O2

void edir(char *dirname)

{
  int __fd;
  int iVar1;
  uint uVar2;
  DIR *__dirp;
  int *piVar3;
  dirent *pdVar4;
  ulong uVar5;
  ulong uVar6;
  char *fn;
  char *t;
  
  __fd = open_read(".");
  if (__fd == -1) {
    fatal("unable to open current working directory");
  }
  iVar1 = chdir(dirname);
  if (iVar1 != 0) {
    fatal2("unable to switch to directory",dirname);
  }
  __dirp = opendir(".");
  if (__dirp == (DIR *)0x0) {
    fatal2("unable to open directory",dirname);
  }
  piVar3 = __errno_location();
  do {
    while( true ) {
      do {
        *piVar3 = 0;
        pdVar4 = readdir(__dirp);
        if (pdVar4 == (dirent *)0x0) {
          if (*piVar3 != 0) {
            fatal2("unable to read directory",dirname);
          }
          closedir(__dirp);
          iVar1 = fchdir(__fd);
          if (iVar1 == -1) {
            fatal("unable to switch to starting directory");
          }
          close(__fd);
          return;
        }
      } while (pdVar4->d_name[0] == '.');
      fn = pdVar4->d_name;
      iVar1 = openreadclose(fn,&sa,0x100);
      if (iVar1 == -1) break;
LAB_001036f2:
      if (sa.len == 0) {
        t = (char *)0x0;
      }
      else {
        uVar2 = byte_chr(sa.s,sa.len,10);
        uVar6 = (ulong)uVar2;
        do {
          uVar5 = uVar6;
          sa.len = (uint)uVar5;
          if (uVar5 == 0) break;
          uVar6 = uVar5 - 1;
        } while ((sa.s[uVar5 - 1] == ' ') || (sa.s[uVar5 - 1] == '\t'));
        for (uVar6 = 0; uVar6 < (uVar5 & 0xffffffff); uVar6 = uVar6 + 1) {
          if (sa.s[uVar6] == '\0') {
            sa.s[uVar6] = '\n';
            uVar5 = (ulong)sa.len;
          }
        }
        iVar1 = stralloc_append(&sa,"");
        t = sa.s;
        if (iVar1 == 0) {
          die_nomem();
          t = sa.s;
        }
      }
      iVar1 = pathexec_env(fn,t);
      if (iVar1 == 0) {
        die_nomem();
      }
    }
    if ((*piVar3 != error_isdir) || (env_dir == (char *)0x0)) {
      strerr_die(0x6f,"chpst: fatal: ","unable to read ",dirname,"/",fn,": ",&strerr_sys);
      goto LAB_001036f2;
    }
    if (verbose != 0) {
      strerr_warn("chpst: warning: ","unable to read ",dirname,"/",fn,": ",&strerr_sys);
    }
  } while( true );
}

Assistant:

void edir(const char *dirname) {
  int wdir;
  DIR *dir;
  direntry *d;
  int i;

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");
  if (chdir(dirname)) fatal2("unable to switch to directory", dirname);
  if (! (dir =opendir("."))) fatal2("unable to open directory", dirname);
  for (;;) {
    errno =0;
    d =readdir(dir);
    if (! d) {
      if (errno) fatal2("unable to read directory", dirname);
      break;
    }
    if (d->d_name[0] == '.') continue;
    if (openreadclose(d->d_name, &sa, 256) == -1) {
      if ((errno == error_isdir) && env_dir) {
        if (verbose)
          strerr_warn6(WARNING, "unable to read ", dirname, "/",
                       d->d_name, ": ", &strerr_sys);
        continue;
      }
      else
        strerr_die6sys(111, FATAL, "unable to read ", dirname, "/",
                             d->d_name, ": ");
    }
    if (sa.len) {
      sa.len =byte_chr(sa.s, sa.len, '\n');
      while (sa.len && (sa.s[sa.len -1] == ' ' || sa.s[sa.len -1] == '\t'))
        --sa.len;
      for (i =0; i < sa.len; ++i) if (! sa.s[i]) sa.s[i] ='\n';
      if (! stralloc_0(&sa)) die_nomem();
      if (! pathexec_env(d->d_name, sa.s)) die_nomem();
    }
    else
      if (! pathexec_env(d->d_name, 0)) die_nomem();
  }
  closedir(dir);
  if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
  close(wdir);
}